

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O1

RsCodeBlockSyntax * __thiscall slang::parsing::Parser::parseRsCodeBlock(Parser *this)

{
  RsCodeBlockSyntax *pRVar1;
  Token openBrace;
  Token closeBrace;
  Token local_68;
  SyntaxList<slang::syntax::SyntaxNode> local_58;
  
  openBrace = ParserBase::expect(&this->super_ParserBase,OpenBrace);
  Token::Token(&local_68);
  local_58.super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL> =
       parseBlockItems(this,CloseBrace,&local_68,false);
  local_58.super_SyntaxListBase.childCount =
       (size_t)local_58.super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>._M_extent.
               _M_extent_value;
  local_58.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_58.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_58.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_58.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005d5868;
  pRVar1 = slang::syntax::SyntaxFactory::rsCodeBlock(&this->factory,openBrace,&local_58,local_68);
  return pRVar1;
}

Assistant:

RsCodeBlockSyntax& Parser::parseRsCodeBlock() {
    auto openBrace = expect(TokenKind::OpenBrace);

    Token closeBrace;
    auto items = parseBlockItems(TokenKind::CloseBrace, closeBrace, /* inConstructor */ false);

    return factory.rsCodeBlock(openBrace, items, closeBrace);
}